

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

void __thiscall Clasp::ShortImplicationsGraph::resize(ShortImplicationsGraph *this,uint32 nodes)

{
  size_type sVar1;
  uint uVar2;
  uint __tmp;
  size_type sVar3;
  pointer pIVar4;
  pointer this_00;
  pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
  local_78;
  ImplicationList local_68;
  
  uVar2 = (this->graph_).ebo_.size;
  if (uVar2 < nodes) {
    if ((this->graph_).ebo_.cap < nodes) {
      local_78.ebo_.buf = (pointer)0x0;
      local_78.ebo_.size = 0;
      local_78.ebo_.cap = 0;
      local_68.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
           &local_68.super_ImpListBase.super_type.
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
            field_0x14;
      local_68.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>._8_4_ = 0x20;
      local_68.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ = 0;
      local_68.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = 0x20
      ;
      sVar3 = 0;
      LOCK();
      local_68.learnt._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::resize(&local_78,nodes,&local_68);
      ImplicationList::~ImplicationList(&local_68);
      if ((this->graph_).ebo_.size != 0) {
        sVar3 = 0;
        do {
          this_00 = local_78.ebo_.buf + sVar3;
          pIVar4 = (this->graph_).ebo_.buf + sVar3;
          bk_lib::
          left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::move
                    (&this_00->super_ImpListBase,&pIVar4->super_ImpListBase);
          operator_delete((this_00->learnt)._M_b._M_p);
          LOCK();
          (this_00->learnt)._M_b._M_p = (pIVar4->learnt)._M_b._M_p;
          UNLOCK();
          LOCK();
          (pIVar4->learnt)._M_b._M_p = (__pointer_type)0x0;
          UNLOCK();
          sVar3 = sVar3 + 1;
        } while (sVar3 != (this->graph_).ebo_.size);
      }
      pIVar4 = (this->graph_).ebo_.buf;
      (this->graph_).ebo_.buf = local_78.ebo_.buf;
      sVar1 = (this->graph_).ebo_.cap;
      (this->graph_).ebo_.size = local_78.ebo_.size;
      (this->graph_).ebo_.cap = local_78.ebo_.cap;
      local_78.ebo_.cap = sVar1;
      local_78.ebo_.size = sVar3;
      if (pIVar4 != (pointer)0x0) {
        local_78.ebo_.buf = pIVar4;
        operator_delete(pIVar4);
      }
    }
    else {
      local_68.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
           &local_68.super_ImpListBase.super_type.
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
            field_0x14;
      local_68.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>._8_4_ = 0x20;
      local_68.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ = 0;
      local_68.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = 0x20
      ;
      LOCK();
      local_68.learnt._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::resize(&this->graph_,nodes,&local_68);
      ImplicationList::~ImplicationList(&local_68);
    }
  }
  else {
    while (uVar2 != nodes) {
      ImplicationList::clear((this->graph_).ebo_.buf + (uVar2 - 1),true);
      uVar2 = (this->graph_).ebo_.size - 1;
      (this->graph_).ebo_.size = uVar2;
    }
  }
  return;
}

Assistant:

void ShortImplicationsGraph::resize(uint32 nodes) {
	if (nodes <= graph_.size()) {
		while (graph_.size() != nodes) {
			graph_.back().clear(true);
			graph_.pop_back();
		}
	}
	else if (graph_.capacity() >= nodes) {
		graph_.resize(nodes);
	}
	else {
		ImpLists temp; temp.resize(nodes);
		for (ImpLists::size_type i = 0; i != graph_.size(); ++i) {
			temp[i].move(graph_[i]);
		}
		graph_.swap(temp);
	}
}